

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O1

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec3f *pts,Vec2f *uvs,TGAImage *texture)

{
  float *pfVar1;
  vec<3,_float,_(glm::qualifier)0> A;
  int iVar2;
  int iVar3;
  TGAColor TVar4;
  long lVar5;
  int j;
  int iVar6;
  Vec3f *pVVar7;
  int iVar8;
  float fVar9;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar10;
  float extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  float extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar11;
  float fVar12;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_XMM7_Da;
  Vec3f VVar17;
  vec<3,_float,_(glm::qualifier)0> P;
  TGAColor c;
  TGAColor local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_80;
  float local_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_48;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_44;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_40;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_3c;
  
  TGAImage::get_width(this->mImage);
  iVar2 = TGAImage::get_width(this->mImage);
  iVar3 = TGAImage::get_height(this->mImage);
  local_98 = (float)(iVar2 + -1);
  _local_78 = ZEXT416((uint)(float)(iVar3 + -1));
  fStack_90 = extraout_XMM0_Dc;
  fStack_8c = extraout_XMM0_Dd;
  iVar2 = TGAImage::get_width(this->mImage);
  iVar3 = TGAImage::get_height(this->mImage);
  lVar5 = 0;
  local_80 = 0.0;
  local_7c = 0.0;
  fVar12 = (float)local_78._0_4_;
  fVar16 = fStack_70;
  fVar9 = fStack_6c;
  do {
    iVar6 = 0;
    do {
      pVVar7 = (Vec3f *)&pts[lVar5].field_2;
      if ((iVar6 != 2) && (pVVar7 = pts + lVar5, iVar6 == 1)) {
        pVVar7 = (Vec3f *)&pts[lVar5].field_1;
      }
      fVar14 = fVar12;
      if (iVar6 != 1) {
        fVar14 = local_98;
      }
      fVar11 = (pVVar7->field_0).x;
      if (fVar14 <= (pVVar7->field_0).x) {
        fVar11 = fVar14;
      }
      if (fVar11 <= 0.0) {
        fVar11 = 0.0;
      }
      if (iVar6 == 1) {
        local_78._4_4_ = 0.0;
        fVar16 = 0.0;
        fVar9 = 0.0;
        fVar12 = fVar11;
      }
      else {
        fStack_90 = 0.0;
        fStack_8c = 0.0;
        local_98 = fVar11;
      }
      pVVar7 = (Vec3f *)&pts[lVar5].field_2;
      if ((iVar6 != 2) && (pVVar7 = pts + lVar5, iVar6 == 1)) {
        pVVar7 = (Vec3f *)&pts[lVar5].field_1;
      }
      iVar8 = iVar2;
      if (iVar6 == 1) {
        iVar8 = iVar3;
      }
      fVar14 = local_7c;
      if (iVar6 != 1) {
        fVar14 = local_80;
      }
      fVar11 = (pVVar7->field_0).x;
      if ((pVVar7->field_0).x <= fVar14) {
        fVar11 = fVar14;
      }
      if ((float)(iVar8 + -1) <= fVar11) {
        fVar11 = (float)(iVar8 + -1);
      }
      if (iVar6 != 1) {
        local_80 = fVar11;
        fVar11 = local_7c;
      }
      local_7c = fVar11;
      iVar6 = iVar6 + 1;
    } while (iVar6 == 1);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_78._0_4_ = (undefined4)(int)(local_98 + 0.5);
  fStack_70 = (float)(int)fStack_90;
  fStack_6c = (float)(int)fStack_8c;
  if ((float)local_78._0_4_ <= local_80) {
    local_68 = (float)(int)(fVar12 + 0.5);
    fStack_64 = (float)(int)(float)local_78._4_4_;
    fStack_60 = (float)(int)fVar16;
    fStack_5c = (float)(int)fVar9;
    do {
      local_98 = local_68;
      fStack_94 = fStack_64;
      fStack_90 = fStack_60;
      fStack_8c = fStack_5c;
      if (local_68 <= local_7c) {
        do {
          A.field_0 = pts->field_0;
          A.field_1 = pts->field_1;
          A.field_2 = pts->field_2;
          local_78._4_4_ = local_98;
          P.field_1.y = local_98;
          P.field_0.x = (float)local_78._0_4_;
          P.field_2 = in_XMM7_Da;
          VVar17 = barycentric<3ul>(A,pts[1],pts[2],P);
          aVar13 = VVar17.field_2;
          aVar10 = VVar17.field_1;
          if (((0.0 <= VVar17.field_0.x) && (0.0 <= aVar10.y)) && (0.0 <= aVar13.z)) {
            fVar12 = pts[2].field_2.z * aVar13.z +
                     (pts->field_2).z * VVar17.field_0.x + pts[1].field_2.z * aVar10.y;
            pfVar1 = this->mZBuffer;
            local_58._8_4_ = extraout_XMM0_Dc_00;
            local_58._0_8_ = VVar17._0_8_;
            local_58._12_4_ = extraout_XMM0_Dd_00;
            local_48 = aVar10;
            aStack_44 = aVar10;
            aStack_40 = aVar10;
            aStack_3c = aVar10;
            iVar2 = TGAImage::get_width(this->mImage);
            if (fVar12 < pfVar1[(int)((float)iVar2 * local_98 + (float)local_78._0_4_)] ||
                fVar12 == pfVar1[(int)((float)iVar2 * local_98 + (float)local_78._0_4_)]) {
              pfVar1 = this->mZBuffer;
              iVar2 = TGAImage::get_width(this->mImage);
              pfVar1[(int)((float)iVar2 * local_98 + (float)local_78._0_4_)] = fVar12;
              fVar9 = (uvs->field_0).x * (float)local_58._0_4_;
              fVar14 = (float)local_58._0_4_ * (uvs->field_1).y;
              fVar11 = uvs[1].field_0.x * local_48.y;
              fVar15 = local_48.y * uvs[1].field_1.y;
              fVar12 = uvs[2].field_0.x;
              fVar16 = uvs[2].field_1.y;
              iVar2 = TGAImage::get_width(texture);
              iVar3 = TGAImage::get_height(texture);
              TVar4 = TGAImage::get(texture,(int)((float)(iVar2 + -1) *
                                                  (fVar12 * aVar13.z + fVar11 + fVar9) + 0.5),
                                    (int)((float)(iVar3 + -1) *
                                          (aVar13.z * fVar16 + fVar15 + fVar14) + 0.5));
              local_a0.bgra = TVar4.bgra;
              local_a0.bytespp = TVar4.bytespp;
              TGAImage::set(this->mImage,(int)(float)local_78._0_4_,(int)local_98,&local_a0);
            }
          }
          local_98 = local_98 + 1.0;
        } while (local_98 <= local_7c);
      }
      fVar12 = (float)local_78._0_4_ + 1.0;
      local_78._0_4_ = (float)local_78._0_4_ + 1.0;
    } while (fVar12 <= local_80);
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec3f* pts, Vec2f* uvs, TGAImage* texture) {
  int width = mImage->get_width();

  Vec2i ptis[3];
  for (size_t i = 0; i < 3; i++) {
    ptis[i][0] = int(pts[i][0] + .5f);
    ptis[i][1] = int(pts[i][1] + .5f);
  }

  Vec2f bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2f bboxmax(0, 0);
  Vec2f clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0.f, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = int(bboxmin.x + .5f); p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = int(bboxmin.y + .5f); p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      if (mZBuffer[int(p.x + p.y * mImage->get_width())] < pz) continue;

      mZBuffer[int(p.x + p.y * mImage->get_width())] = pz;
      /**
       * Calculate texture color
       **/
      Vec2f uvf =
          uvs[0] * bc_screen[0] + uvs[1] * bc_screen[1] + uvs[2] * bc_screen[2];
      TGAColor c =
          texture->get(int((texture->get_width() - 1) * uvf[0] + .5f),
                       int((texture->get_height() - 1) * uvf[1] + .5f));
      mImage->set(p[0], p[1], c);
    }
  }
}